

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_file.cpp
# Opt level: O2

void __thiscall
MemoryFile_WriteToInitiallyEmptyFile_Test::TestBody(MemoryFile_WriteToInitiallyEmptyFile_Test *this)

{
  bool bVar1;
  pointer *__ptr;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  char *pcVar2;
  char *in_R9;
  AssertHelper local_b8;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  AssertHelper local_80;
  buffer buffer;
  not_null<const_void_*> local_68;
  size_t elements;
  in_memory mf;
  
  elements = 5;
  anon_unknown.dwarf_146a0::MemoryFile::make_buffer
            ((MemoryFile *)&buffer.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>,5);
  buffer.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr[4] = '\0';
  buffer.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr[0] = '\0';
  buffer.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1] = '\0';
  buffer.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr[2] = '\0';
  buffer.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr[3] = '\0';
  std::__shared_ptr<void,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<unsigned_char,void>
            ((__shared_ptr<void,(__gnu_cxx::_Lock_policy)2> *)&gtest_ar,
             &buffer.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>);
  pstore::file::in_memory::in_memory(&mf,(shared_ptr<void> *)&gtest_ar,5,0,true);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&gtest_ar.message_);
  gtest_ar_.success_ = true;
  gtest_ar_._1_7_ = 0;
  testing::internal::CmpHelperGE<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar,"sizeof (source)","elements",(unsigned_long *)&gtest_ar_,
             &elements);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/os/test_file.cpp"
               ,0x1de,pcVar2);
    testing::internal::AssertHelper::operator=(&local_b8,(Message *)&gtest_ar_);
    this_00 = &gtest_ar.message_;
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    if (gtest_ar_._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
    }
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    local_68.ptr_ = "Hello";
    pstore::gsl::not_null<const_void_*>::ensure_invariant(&local_68);
    pstore::file::in_memory::write_buffer(&mf,local_68,5);
    local_b8.data_._0_4_ = 5;
    gtest_ar_._0_8_ = mf.pos_;
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              ((internal *)&gtest_ar,"5U","mf.tell ()",(uint *)&local_b8,(unsigned_long *)&gtest_ar_
              );
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_b8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/os/test_file.cpp"
                 ,0x1e0,pcVar2);
      testing::internal::AssertHelper::operator=(&local_b8,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper(&local_b8);
      if (gtest_ar_._0_8_ != 0) {
        (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    local_b8.data_._0_4_ = 5;
    gtest_ar_._0_8_ = mf.eof_;
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              ((internal *)&gtest_ar,"5U","mf.size ()",(uint *)&local_b8,(unsigned_long *)&gtest_ar_
              );
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_b8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/os/test_file.cpp"
                 ,0x1e1,pcVar2);
      testing::internal::AssertHelper::operator=(&local_b8,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper(&local_b8);
      if (gtest_ar_._0_8_ != 0) {
        (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    bVar1 = std::__equal<false>::equal<unsigned_char*,char_const*>
                      (buffer.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                       buffer.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                       5,"Hello");
    this_00 = &gtest_ar_.message_;
    gtest_ar_.success_ = bVar1;
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    if (!bVar1) {
      testing::Message::Message((Message *)&local_b8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar,(internal *)&gtest_ar_,
                 (AssertionResult *)"std::equal (buffer.get (), buffer.get () + elements, source)",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_80,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/os/test_file.cpp"
                 ,0x1e3,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
      testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_b8);
      testing::internal::AssertHelper::~AssertHelper(&local_80);
      std::__cxx11::string::~string((string *)&gtest_ar);
      if ((long *)CONCAT44(local_b8.data_._4_4_,local_b8.data_._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_b8.data_._4_4_,local_b8.data_._0_4_) + 8))();
      }
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(this_00);
  pstore::file::in_memory::~in_memory(&mf);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&buffer.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST_F (MemoryFile, WriteToInitiallyEmptyFile) {
    constexpr std::size_t elements = 5;
    auto buffer = MemoryFile::make_buffer (elements);
    std::fill (buffer.get (), buffer.get () + elements, std::uint8_t{0});
    pstore::file::in_memory mf (buffer, elements);

    char const * source = "Hello";
    ASSERT_GE (sizeof (source), elements);
    mf.write_buffer (source, elements);
    EXPECT_EQ (5U, mf.tell ());
    EXPECT_EQ (5U, mf.size ());

    EXPECT_TRUE (std::equal (buffer.get (), buffer.get () + elements, source));
}